

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::processAttributeDeclRef
          (TraverseSchema *this,DOMElement *elem,ComplexTypeInfo *typeInfo,XMLCh *refName,
          XMLCh *useAttr,XMLCh *defaultVal,XMLCh *fixedVal)

{
  uint saveScope_00;
  SchemaInfo *toRestore;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  DefAttTypes defType;
  ValidatorType VVar6;
  AttTypes type;
  XMLCh *pXVar7;
  XMLCh *pXVar8;
  SchemaAttDef *pSVar9;
  SchemaGrammar *this_00;
  RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> *this_01;
  SchemaInfo *this_02;
  DOMElement *elem_00;
  DatatypeValidator *this_03;
  QName *this_04;
  XMLCh *localPart_00;
  ValidationContext *pVVar10;
  bool toClone;
  XMLException *excep;
  OutOfMemoryException *anon_var_0;
  XMLCh *valueConstraint;
  SchemaAttDef *attDef;
  QName *attQName;
  bool prohibited;
  bool required;
  DatatypeValidator *attDV;
  bool invalidAttUse;
  XMLCh *refAttValue;
  DefAttTypes refAttDefType;
  DOMElement *referredAttribute;
  SchemaInfo *impInfo;
  Grammar *grammar;
  uint uriId;
  uint saveScope;
  SchemaAttDef *refAttDef;
  ListType infoType;
  SchemaInfo *saveInfo;
  uint attURI;
  XMLCh *uriStr;
  XMLCh *localPart;
  XMLCh *prefix;
  XMLCh *defaultVal_local;
  XMLCh *useAttr_local;
  XMLCh *refName_local;
  ComplexTypeInfo *typeInfo_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  if ((typeInfo != (ComplexTypeInfo *)0x0) ||
     (this->fCurrentAttGroupInfo != (XercesAttGroupInfo *)0x0)) {
    pXVar7 = getPrefix(this,refName);
    pXVar8 = getLocalPart(this,refName);
    pXVar7 = resolvePrefixToURI(this,elem,pXVar7);
    uVar4 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                      (this->fURIStringPool,pXVar7);
    if ((typeInfo == (ComplexTypeInfo *)0x0) ||
       (pSVar9 = ComplexTypeInfo::getAttDef(typeInfo,pXVar8,uVar4), pSVar9 == (SchemaAttDef *)0x0))
    {
      if ((this->fCurrentAttGroupInfo == (XercesAttGroupInfo *)0x0) ||
         (bVar1 = XercesAttGroupInfo::containsAttribute(this->fCurrentAttGroupInfo,pXVar8,uVar4),
         !bVar1)) {
        toRestore = this->fSchemaInfo;
        refAttDef._4_4_ = INCLUDE;
        _uriId = (SchemaAttDef *)0x0;
        saveScope_00 = this->fCurrentScope;
        bVar1 = XMLString::equals(pXVar7,this->fTargetNSURIString);
        if (!bVar1) {
          iVar5 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                            (this->fURIStringPool,pXVar7);
          bVar1 = isImportingNS(this,iVar5);
          if (!bVar1) {
            reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x8e,pXVar7,(XMLCh *)0x0,
                              (XMLCh *)0x0,(XMLCh *)0x0);
            return;
          }
          this_00 = (SchemaGrammar *)GrammarResolver::getGrammar(this->fGrammarResolver,pXVar7);
          if ((this_00 == (SchemaGrammar *)0x0) ||
             (iVar5 = (*(this_00->super_Grammar).super_XSerializable._vptr_XSerializable[5])(),
             iVar5 != 1)) {
            reportSchemaError(this,elem,(XMLCh *)XMLUni::fgValidityDomain,0x26,pXVar7,(XMLCh *)0x0,
                              (XMLCh *)0x0,(XMLCh *)0x0);
            return;
          }
          this_01 = SchemaGrammar::getAttributeDeclRegistry(this_00);
          _uriId = (SchemaAttDef *)
                   RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher>::get
                             (this_01,pXVar8);
          if (_uriId == (SchemaAttDef *)0x0) {
            this_02 = SchemaInfo::getImportInfo(this->fSchemaInfo,uVar4);
            if ((this_02 == (SchemaInfo *)0x0) || (bVar1 = SchemaInfo::getProcessed(this_02), bVar1)
               ) {
              reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x29,refName,(XMLCh *)0x0,
                                (XMLCh *)0x0,(XMLCh *)0x0);
              return;
            }
            refAttDef._4_4_ = IMPORT;
            restoreSchemaInfo(this,this_02,IMPORT,0xfffffffe);
          }
        }
        if (_uriId == (SchemaAttDef *)0x0) {
          bVar1 = RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher>::containsKey
                            (this->fAttributeDeclRegistry,pXVar8);
          if ((!bVar1) &&
             (elem_00 = SchemaInfo::getTopLevelComponent
                                  (this->fSchemaInfo,3,(XMLCh *)SchemaSymbols::fgELT_ATTRIBUTE,
                                   pXVar8,&this->fSchemaInfo), elem_00 != (DOMElement *)0x0)) {
            traverseAttributeDecl(this,elem_00,(ComplexTypeInfo *)0x0,true);
          }
          _uriId = (SchemaAttDef *)
                   RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher>::get
                             (this->fAttributeDeclRegistry,pXVar8);
        }
        if (this->fSchemaInfo != toRestore) {
          restoreSchemaInfo(this,toRestore,refAttDef._4_4_,saveScope_00);
        }
        if (_uriId == (SchemaAttDef *)0x0) {
          reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x29,refName,(XMLCh *)0x0,
                            (XMLCh *)0x0,(XMLCh *)0x0);
        }
        else {
          defType = XMLAttDef::getDefaultType(&_uriId->super_XMLAttDef);
          pXVar7 = XMLAttDef::getValue(&_uriId->super_XMLAttDef);
          bVar1 = false;
          if ((defType == Fixed) &&
             ((defaultVal != (XMLCh *)0x0 ||
              ((fixedVal != (XMLCh *)0x0 && (bVar2 = XMLString::equals(fixedVal,pXVar7), !bVar2)))))
             ) {
            bVar1 = true;
            reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x87,refName,(XMLCh *)0x0,
                              (XMLCh *)0x0,(XMLCh *)0x0);
          }
          this_03 = SchemaAttDef::getDatatypeValidator(_uriId);
          if ((this_03 != (DatatypeValidator *)0x0) &&
             (VVar6 = DatatypeValidator::getType(this_03), VVar6 == ID)) {
            if (this->fCurrentAttGroupInfo == (XercesAttGroupInfo *)0x0) {
              bVar2 = ComplexTypeInfo::containsAttWithTypeId(typeInfo);
              if (bVar2) {
                reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x89,refName,
                                  (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
                return;
              }
              ComplexTypeInfo::setAttWithTypeId(typeInfo,true);
            }
            else {
              bVar2 = XercesAttGroupInfo::containsTypeWithId(this->fCurrentAttGroupInfo);
              if (bVar2) {
                reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x8a,refName,
                                  (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
                return;
              }
              XercesAttGroupInfo::setTypeWithId(this->fCurrentAttGroupInfo,true);
            }
          }
          bVar2 = XMLString::equals(useAttr,(XMLCh *)SchemaSymbols::fgATTVAL_REQUIRED);
          bVar3 = XMLString::equals(useAttr,(XMLCh *)SchemaSymbols::fgATTVAL_PROHIBITED);
          this_04 = SchemaAttDef::getAttName(_uriId);
          pSVar9 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
          pXVar8 = QName::getPrefix(this_04);
          localPart_00 = QName::getLocalPart(this_04);
          uVar4 = QName::getURI(this_04);
          type = XMLAttDef::getType(&_uriId->super_XMLAttDef);
          SchemaAttDef::SchemaAttDef
                    (pSVar9,pXVar8,localPart_00,uVar4,pXVar7,type,defType,(XMLCh *)0x0,
                     this->fGrammarPoolMemoryManager);
          SchemaAttDef::setBaseAttDecl(pSVar9,_uriId);
          SchemaAttDef::setPSVIScope(pSVar9,SCP_GLOBAL);
          if (defType == Fixed) {
            if ((bVar2) && (!bVar1)) {
              XMLAttDef::setDefaultType((XMLAttDef *)pSVar9,Required_And_Fixed);
            }
          }
          else if (bVar3) {
            XMLAttDef::setDefaultType((XMLAttDef *)pSVar9,DefAttTypes_Max);
          }
          else {
            anon_var_0 = (OutOfMemoryException *)defaultVal;
            if (bVar2) {
              if (fixedVal == (XMLCh *)0x0) {
                XMLAttDef::setDefaultType((XMLAttDef *)pSVar9,Required);
              }
              else {
                XMLAttDef::setDefaultType((XMLAttDef *)pSVar9,Required_And_Fixed);
                anon_var_0 = (OutOfMemoryException *)fixedVal;
              }
            }
            else if (fixedVal == (XMLCh *)0x0) {
              if (defaultVal != (XMLCh *)0x0) {
                XMLAttDef::setDefaultType((XMLAttDef *)pSVar9,DefAttTypes_Min);
              }
            }
            else {
              XMLAttDef::setDefaultType((XMLAttDef *)pSVar9,Fixed);
              anon_var_0 = (OutOfMemoryException *)fixedVal;
            }
            if (anon_var_0 != (OutOfMemoryException *)0x0) {
              if (this_03 != (DatatypeValidator *)0x0) {
                VVar6 = DatatypeValidator::getType(this_03);
                if (VVar6 == ID) {
                  reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x88,refName,
                                    (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
                }
                else {
                  pVVar10 = SchemaInfo::getValidationContext(this->fSchemaInfo);
                  (*(this_03->super_XSerializable)._vptr_XSerializable[8])
                            (this_03,anon_var_0,pVVar10,this->fMemoryManager);
                }
              }
              XMLAttDef::setValue((XMLAttDef *)pSVar9,(XMLCh *)anon_var_0);
            }
          }
          SchemaAttDef::setDatatypeValidator(pSVar9,this_03);
          if (typeInfo != (ComplexTypeInfo *)0x0) {
            ComplexTypeInfo::addAttDef(typeInfo,pSVar9);
          }
          if (this->fCurrentAttGroupInfo != (XercesAttGroupInfo *)0x0) {
            XercesAttGroupInfo::addAttDef
                      (this->fCurrentAttGroupInfo,pSVar9,typeInfo != (ComplexTypeInfo *)0x0);
          }
        }
      }
      else {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x46,pXVar7,pXVar8,(XMLCh *)0x0,
                          (XMLCh *)0x0);
      }
    }
    else {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x46,pXVar7,pXVar8,(XMLCh *)0x0,
                        (XMLCh *)0x0);
    }
  }
  return;
}

Assistant:

void TraverseSchema::processAttributeDeclRef(const DOMElement* const elem,
                                             ComplexTypeInfo* const typeInfo,
                                             const XMLCh* const refName,
                                             const XMLCh* const useAttr,
                                             const XMLCh* const defaultVal,
                                             const XMLCh* const fixedVal) {

    if (!typeInfo && !fCurrentAttGroupInfo) {
        return;
    }

    const XMLCh* prefix = getPrefix(refName);
    const XMLCh* localPart = getLocalPart(refName);
    const XMLCh* uriStr = resolvePrefixToURI(elem, prefix);
    unsigned int attURI = fURIStringPool->addOrFind(uriStr);

    // Check for duplicate references
    if (typeInfo && typeInfo->getAttDef(localPart, attURI)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateRefAttribute, uriStr, localPart);
        return;
    }
    else if (fCurrentAttGroupInfo && fCurrentAttGroupInfo->containsAttribute(localPart, attURI)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateRefAttribute, uriStr, localPart);
        return;
    }

    // check for different namespace
    SchemaInfo* saveInfo = fSchemaInfo;
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    SchemaAttDef* refAttDef = 0;
    unsigned int saveScope = fCurrentScope;

    if (!XMLString::equals(uriStr, fTargetNSURIString)) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        unsigned int uriId = fURIStringPool->addOrFind(uriStr);

        if (!isImportingNS(uriId)) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, uriStr);
            return;
        }

        Grammar* grammar = fGrammarResolver->getGrammar(uriStr);

        if (grammar == 0 || grammar->getGrammarType() != Grammar::SchemaGrammarType) {

            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::GrammarNotFound, uriStr);
            return;
        }

        refAttDef = (SchemaAttDef*) ((SchemaGrammar*) grammar)->getAttributeDeclRegistry()->get(localPart);

        if (!refAttDef) {

            SchemaInfo* impInfo = fSchemaInfo->getImportInfo(attURI);

            if (!impInfo || impInfo->getProcessed()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TopLevelAttributeNotFound, refName);
                return;
            }

            infoType = SchemaInfo::IMPORT;
            restoreSchemaInfo(impInfo, infoType);
        }
    }

    // if Global attribute registry does not contain the ref attribute, get
    // the referred attribute declaration and traverse it.
    if (!refAttDef) {

        if (fAttributeDeclRegistry->containsKey(localPart) == false) {

            DOMElement* referredAttribute = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_Attribute,
                SchemaSymbols::fgELT_ATTRIBUTE, localPart, &fSchemaInfo);

            if (referredAttribute != 0) {
                traverseAttributeDecl(referredAttribute, 0, true);
            }
        }

        refAttDef = (SchemaAttDef*) fAttributeDeclRegistry->get(localPart);
    }

    // restore schema information, if necessary
    if (fSchemaInfo != saveInfo) {
        restoreSchemaInfo(saveInfo, infoType, saveScope);
    }

    if (!refAttDef) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TopLevelAttributeNotFound, refName);
        return;
    }

    XMLAttDef::DefAttTypes refAttDefType = refAttDef->getDefaultType();
    const XMLCh* refAttValue = refAttDef->getValue();
    bool invalidAttUse = false;

    if (refAttDefType == XMLAttDef::Fixed &&
        (defaultVal || (fixedVal && !XMLString::equals(fixedVal, refAttValue)))) {

        invalidAttUse = true;
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttUseCorrect, refName);
    }

    DatatypeValidator* attDV = refAttDef->getDatatypeValidator();

    //check for multiple attributes with type derived from ID
    if (attDV && attDV->getType() == DatatypeValidator::ID) {

        if (fCurrentAttGroupInfo) {

            if (fCurrentAttGroupInfo->containsTypeWithId()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttGrpPropCorrect3, refName);
                return;
            }

            fCurrentAttGroupInfo->setTypeWithId(true);
        }
        else {

            if (typeInfo->containsAttWithTypeId()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttDeclPropCorrect5, refName);
                return;
            }

            typeInfo->setAttWithTypeId(true);
        }
    }

    bool required = XMLString::equals(useAttr,SchemaSymbols::fgATTVAL_REQUIRED);
    bool prohibited = XMLString::equals(useAttr,SchemaSymbols::fgATTVAL_PROHIBITED);
    QName* attQName = refAttDef->getAttName();
    SchemaAttDef* attDef = new (fGrammarPoolMemoryManager) SchemaAttDef(attQName->getPrefix(),
                                            attQName->getLocalPart(),
                                            attQName->getURI(),
                                            refAttValue,
                                            refAttDef->getType(),
                                            refAttDefType,
                                            0, fGrammarPoolMemoryManager);

    attDef->setBaseAttDecl(refAttDef);
    attDef->setPSVIScope(PSVIDefs::SCP_GLOBAL);

    if (refAttDefType == XMLAttDef::Fixed) {
        if (required && !invalidAttUse) {
            attDef->setDefaultType(XMLAttDef::Required_And_Fixed);
        }
    }
    else {

        if (prohibited) {
            attDef->setDefaultType(XMLAttDef::Prohibited);
        }
        else {

            const XMLCh* valueConstraint = defaultVal;

            if (required){

                if (fixedVal) {

                    attDef->setDefaultType(XMLAttDef::Required_And_Fixed);
                    valueConstraint = fixedVal;
                }
                else {
                    attDef->setDefaultType(XMLAttDef::Required);
                }
            }
            else
            {
                if (fixedVal) {
                    attDef->setDefaultType(XMLAttDef::Fixed);
                    valueConstraint = fixedVal;
                }
                else if (defaultVal) {
                    attDef->setDefaultType(XMLAttDef::Default);
                }
            }

            if (valueConstraint) {

                // validate content of value constraint
                if (attDV) {

                    if (attDV->getType() == DatatypeValidator::ID) {
                        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttDeclPropCorrect3, refName);
                    }
                    else {
                        try {
                            attDV->validate(valueConstraint
                                          , fSchemaInfo->getValidationContext()
                                          , fMemoryManager);
                        }
                        catch(const XMLException& excep) {
                            reportSchemaError(elem, excep);
                        }
                        catch(const OutOfMemoryException&)
                        {
                            throw;
                        }
                        catch (...) {
                            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::DatatypeValidationFailure, valueConstraint);
                        }
                    }
                }

                attDef->setValue(valueConstraint);
            }
        }
    }

    attDef->setDatatypeValidator(attDV);

    bool toClone = false;

    if (typeInfo) {

        toClone = true;
        typeInfo->addAttDef(attDef);
    }

    if (fCurrentAttGroupInfo) {
        fCurrentAttGroupInfo->addAttDef(attDef, toClone);
    }
}